

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimationKeyFrame
          (OgreBinarySerializer *this,VertexAnimationTrack *dest)

{
  undefined1 local_44 [8];
  TransformKeyFrame keyframe;
  VertexAnimationTrack *dest_local;
  OgreBinarySerializer *this_local;
  
  keyframe.scale._4_8_ = dest;
  TransformKeyFrame::TransformKeyFrame((TransformKeyFrame *)local_44);
  local_44._0_4_ = Read<float>(this);
  ReadQuaternion(this,(aiQuaternion *)(local_44 + 4));
  ReadVector(this,(aiVector3D *)&keyframe.rotation.y);
  if (0x26 < this->m_currentLen) {
    ReadVector(this,(aiVector3D *)&keyframe.position.y);
  }
  std::vector<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>::
  push_back((vector<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
             *)(keyframe.scale._4_8_ + 0x58),(value_type *)local_44);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimationKeyFrame(VertexAnimationTrack *dest)
{
    TransformKeyFrame keyframe;
    keyframe.timePos = Read<float>();

    // Rot and pos
    ReadQuaternion(keyframe.rotation);
    ReadVector(keyframe.position);

    // Scale (optional)
    if (m_currentLen > MSTREAM_KEYFRAME_SIZE_WITHOUT_SCALE)
        ReadVector(keyframe.scale);

    dest->transformKeyFrames.push_back(keyframe);
}